

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O1

void Omega_h::map_into<signed_char>
               (Read<signed_char> *a_data,LOs *a2b,Write<signed_char> *b_data,Int width)

{
  int iVar1;
  long *plVar2;
  Alloc **ppAVar3;
  Alloc *pAVar4;
  ulong uVar5;
  int n;
  size_t sVar6;
  int iVar7;
  ScopedTimer omega_h_scoped_function_timer;
  type f;
  string __str;
  ScopedTimer local_c9;
  undefined1 local_c8 [24];
  Alloc *pAStack_b0;
  void *local_a8;
  Alloc *local_a0;
  void *local_98;
  Alloc **local_90;
  long local_88;
  Alloc *local_80 [2];
  Alloc **local_70;
  long local_68;
  Alloc *local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
             ,"");
  plVar2 = (long *)std::__cxx11::string::append((char *)local_50);
  ppAVar3 = (Alloc **)(plVar2 + 2);
  if ((Alloc **)*plVar2 == ppAVar3) {
    local_60 = *ppAVar3;
    lStack_58 = plVar2[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *ppAVar3;
    local_70 = (Alloc **)*plVar2;
  }
  local_68 = plVar2[1];
  *plVar2 = (long)ppAVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_90 = local_80;
  std::__cxx11::string::_M_construct((ulong)&local_90,'\x02');
  *(undefined2 *)local_90 = 0x3732;
  pAVar4 = (Alloc *)0xf;
  if (local_70 != &local_60) {
    pAVar4 = local_60;
  }
  if (pAVar4 < (Alloc *)(local_88 + local_68)) {
    pAVar4 = (Alloc *)0xf;
    if (local_90 != local_80) {
      pAVar4 = local_80[0];
    }
    if ((Alloc *)(local_88 + local_68) <= pAVar4) {
      plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70)
      ;
      goto LAB_002fe495;
    }
  }
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
LAB_002fe495:
  local_c8._0_8_ = local_c8 + 0x10;
  pAVar4 = (Alloc *)(plVar2 + 2);
  if ((Alloc *)*plVar2 == pAVar4) {
    local_c8._16_8_ = pAVar4->size;
    pAStack_b0 = (Alloc *)plVar2[3];
  }
  else {
    local_c8._16_8_ = pAVar4->size;
    local_c8._0_8_ = (Alloc *)*plVar2;
  }
  local_c8._8_8_ = plVar2[1];
  *plVar2 = (long)pAVar4;
  plVar2[1] = 0;
  *(undefined1 *)&pAVar4->size = 0;
  begin_code("map_into",(char *)local_c8._0_8_);
  if ((Alloc *)local_c8._0_8_ != (Alloc *)(local_c8 + 0x10)) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,(ulong)((long)&local_80[0]->size + 1));
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,(ulong)((long)&local_60->size + 1));
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  pAVar4 = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar4 & 1) == 0) {
    sVar6 = pAVar4->size;
  }
  else {
    sVar6 = (ulong)pAVar4 >> 3;
  }
  pAVar4 = (a_data->write_).shared_alloc_.alloc;
  if (((ulong)pAVar4 & 1) == 0) {
    iVar1 = (int)pAVar4->size;
  }
  else {
    iVar1 = (int)((ulong)pAVar4 >> 3);
  }
  n = (int)(sVar6 >> 2);
  iVar7 = n * width;
  if (iVar7 != iVar1) {
    if (((ulong)pAVar4 & 1) == 0) {
      uVar5 = pAVar4->size;
    }
    else {
      uVar5 = (ulong)pAVar4 >> 3;
    }
    printf("ERROR: a_data.size= %d na= %d width= %d\n",uVar5,sVar6 >> 2 & 0xffffffff,
           (ulong)(uint)width);
  }
  local_a0 = (a_data->write_).shared_alloc_.alloc;
  if (((ulong)local_a0 & 1) == 0) {
    iVar1 = (int)local_a0->size;
  }
  else {
    iVar1 = (int)((ulong)local_a0 >> 3);
  }
  if (iVar7 == iVar1) {
    local_c8._0_8_ = (a2b->write_).shared_alloc_.alloc;
    if ((local_c8._0_8_ & 7) == 0 && (Alloc *)local_c8._0_8_ != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_c8._0_8_ = ((Alloc *)local_c8._0_8_)->size * 8 + 1;
      }
      else {
        ((Alloc *)local_c8._0_8_)->use_count = ((Alloc *)local_c8._0_8_)->use_count + 1;
      }
    }
    local_c8._8_8_ = (a2b->write_).shared_alloc_.direct_ptr;
    local_c8._16_4_ = width;
    pAStack_b0 = (b_data->shared_alloc_).alloc;
    if (((ulong)pAStack_b0 & 7) == 0 && pAStack_b0 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        pAStack_b0 = (Alloc *)(pAStack_b0->size * 8 + 1);
      }
      else {
        pAStack_b0->use_count = pAStack_b0->use_count + 1;
      }
    }
    local_a8 = (b_data->shared_alloc_).direct_ptr;
    if (((ulong)local_a0 & 7) == 0 && local_a0 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_a0 = (Alloc *)(local_a0->size * 8 + 1);
      }
      else {
        local_a0->use_count = local_a0->use_count + 1;
      }
    }
    local_98 = (a_data->write_).shared_alloc_.direct_ptr;
    parallel_for<Omega_h::map_into<signed_char>(Omega_h::Read<signed_char>,Omega_h::Read<int>,Omega_h::Write<signed_char>,int)::_lambda(int)_1_>
              (n,(type *)local_c8);
    map_into<signed_char>(Omega_h::Read<signed_char>,Omega_h::Read<int>,Omega_h::Write<signed_char>,int)
    ::{lambda(int)#1}::~Write((_lambda_int__1_ *)local_c8);
    ScopedTimer::~ScopedTimer(&local_c9);
    return;
  }
  fail("assertion %s failed at %s +%d\n","a_data.size() == na * width",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
       ,0x1d);
}

Assistant:

void map_into(Read<T> a_data, LOs a2b, Write<T> b_data, Int width) {
  OMEGA_H_TIME_FUNCTION;
  auto na = a2b.size();
  OMEGA_H_CHECK_PRINTF(a_data.size() == na * width, "a_data.size= %d na= %d width= %d", a_data.size(), na, width);
  auto f = OMEGA_H_LAMBDA(LO a) {
    auto b = a2b[a];
    for (Int j = 0; j < width; ++j) {
      b_data[b * width + j] = a_data[a * width + j];
    }
  };
  parallel_for(na, std::move(f));
}